

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_keyinputw(Terminal *term,wchar_t *widebuf,wchar_t len)

{
  strbuf *buf_o;
  strbuf *buf;
  wchar_t len_local;
  wchar_t *widebuf_local;
  Terminal *term_local;
  
  buf_o = term_input_data_from_unicode(term,widebuf,len);
  if (buf_o->len != 0) {
    term_keyinput_internal(term,buf_o->s,(wchar_t)buf_o->len,true);
  }
  strbuf_free(buf_o);
  return;
}

Assistant:

void term_keyinputw(Terminal *term, const wchar_t *widebuf, int len)
{
    strbuf *buf = term_input_data_from_unicode(term, widebuf, len);
    if (buf->len)
        term_keyinput_internal(term, buf->s, buf->len, true);
    strbuf_free(buf);
}